

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ParseNoReflection(internal *this,string_view from,MessageLite *to)

{
  undefined1 uVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  MessageLite *this_00;
  long in_FS_OFFSET;
  string_view flat;
  ParseContext PStack_98;
  
  this_00 = (MessageLite *)from._M_str;
  uVar1 = *(undefined1 *)(in_FS_OFFSET + -0x60);
  *(undefined1 *)(in_FS_OFFSET + -0x60) = 0;
  (*this_00->_vptr_MessageLite[2])(this_00);
  PStack_98.super_EpsCopyInputStream.zcis_ = (ZeroCopyInputStream *)0x0;
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[1] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[2] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[3] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[4] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[5] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[6] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[7] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[8] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[9] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[10] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0xb] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0xc] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0xd] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0xe] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0xf] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x10] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x11] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x12] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x13] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x14] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x15] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x16] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x17] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x18] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x19] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x1a] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x1b] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x1c] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x1d] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x1e] = '\0';
  PStack_98.super_EpsCopyInputStream.patch_buffer_[0x1f] = '\0';
  PStack_98.super_EpsCopyInputStream.aliasing_ = 0;
  PStack_98.super_EpsCopyInputStream.last_tag_minus_1_ = 0;
  PStack_98.super_EpsCopyInputStream.overall_limit_ = 0x7fffffff;
  PStack_98.depth_ = io::CodedInputStream::default_recursion_limit_;
  PStack_98.group_depth_ = -0x80000000;
  PStack_98.data_.pool = (DescriptorPool *)0x0;
  PStack_98.data_.factory = (MessageFactory *)0x0;
  flat._M_str = (char *)from._M_len;
  flat._M_len = (size_t)this;
  pcVar4 = EpsCopyInputStream::InitFrom(&PStack_98.super_EpsCopyInputStream,flat);
  pcVar4 = MessageLite::_InternalParse(this_00,pcVar4,&PStack_98);
  bVar3 = false;
  if ((pcVar4 != (char *)0x0) &&
     (bVar3 = false, PStack_98.super_EpsCopyInputStream.last_tag_minus_1_ == 0)) {
    bVar2 = MessageLite::IsInitialized(this_00);
    bVar3 = true;
    if (!bVar2) {
      MessageLite::LogInitializationErrorMessage(this_00);
      bVar3 = false;
    }
  }
  *(undefined1 *)(in_FS_OFFSET + -0x60) = uVar1;
  return bVar3;
}

Assistant:

bool ParseNoReflection(absl::string_view from, google::protobuf::MessageLite& to) {
  auto cleanup = DisableTracking();

  to.Clear();
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             false, &ptr, from);
  ptr = to._InternalParse(ptr, &ctx);
  if (ptr == nullptr || !ctx.EndedAtLimit()) return false;
  return to.IsInitializedWithErrors();
}